

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceD.cpp
# Opt level: O3

ostream * operator<<(ostream *os,SequenceD<64> *t_seq)

{
  string local_30;
  
  SequenceD<64>::as_char_string_abi_cxx11_(&local_30,t_seq);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, SequenceD<64> &t_seq) {
    os << t_seq.as_char_string();
    return os;
}